

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh4_factory.cpp
# Opt level: O2

Accel * __thiscall embree::BVH4Factory::BVH4InstanceArrayMB(BVH4Factory *this,Scene *scene)

{
  BVHN<4> *this_00;
  Builder *builder;
  AccelInstance *this_01;
  Intersectors intersectors;
  Intersectors IStack_138;
  
  this_00 = (BVHN<4> *)BVHN<4>::operator_new(0x240);
  BVHN<4>::BVHN(this_00,(PrimitiveType *)&InstanceArrayPrimitive::type,scene);
  BVH4InstanceArrayMBIntersectors(&IStack_138,this,this_00);
  builder = (*this->BVH4InstanceArrayMBSceneBuilderSAH)(this_00,scene,MTY_INSTANCE_ARRAY);
  this_01 = (AccelInstance *)Accel::operator_new(0x180);
  AccelInstance::AccelInstance(this_01,(AccelData *)this_00,builder,&IStack_138);
  return &this_01->super_Accel;
}

Assistant:

Accel* BVH4Factory::BVH4InstanceArrayMB(Scene* scene)
  {
    BVH4* accel = new BVH4(InstanceArrayPrimitive::type,scene);
    Accel::Intersectors intersectors = BVH4InstanceArrayMBIntersectors(accel);
    Builder* builder = BVH4InstanceArrayMBSceneBuilderSAH(accel,scene,Geometry::MTY_INSTANCE_ARRAY);
    return new AccelInstance(accel,builder,intersectors);
  }